

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkDeclarationInArith(CheckerVisitor *this,BinExpr *bin)

{
  ulong uVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  int32_t iStack_28;
  int32_t local_24;
  
  if (((this->effectsOnly == false) &&
      (uVar1 = (ulong)(bin->super_Expr).super_Node._op, uVar1 < 0x3d)) &&
     ((0x100df7f9f0600000U >> (uVar1 & 0x3f) & 1) != 0)) {
    pEVar2 = maybeEval(this,bin->_lhs,&iStack_28,false);
    pEVar3 = maybeEval(this,bin->_rhs,&local_24,false);
    if ((pEVar2->super_Node)._op - TO_DECL_EXPR < 2) {
      report(this,&bin->_lhs->super_Node,0x7b);
    }
    if ((1 < (bin->super_Expr).super_Node._op - TO_OROR) &&
       ((pEVar3->super_Node)._op - TO_DECL_EXPR < 2)) {
      report(this,&bin->_rhs->super_Node,0x7b);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkDeclarationInArith(const BinExpr *bin) {

  if (effectsOnly)
    return;

  if (isArithOperator(bin->op())) {
    const Expr *lhs = maybeEval(bin->lhs());
    const Expr *rhs = maybeEval(bin->rhs());

    if (lhs->op() == TO_DECL_EXPR || lhs->op() == TO_ARRAYEXPR) {
      report(bin->lhs(), DiagnosticsId::DI_DECL_IN_EXPR);
    }

    if (bin->op() != TO_OROR && bin->op() != TO_ANDAND) {
      if (rhs->op() == TO_DECL_EXPR || rhs->op() == TO_ARRAYEXPR) {
        report(bin->rhs(), DiagnosticsId::DI_DECL_IN_EXPR);
      }
    }
  }
}